

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O1

string * __thiscall
pbrt::GBufferFilm::ToString_abi_cxx11_(string *__return_storage_ptr__,GBufferFilm *this)

{
  RGBColorSpace *args;
  string local_40;
  
  FilmBase::BaseToString_abi_cxx11_(&local_40,&this->super_FilmBase);
  args = this->colorSpace;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<std::__cxx11::string,pbrt::RGBColorSpace_const&,float_const&,bool_const&>
            (__return_storage_ptr__,
             "[ GBufferFilm %s colorSpace: %s maxComponentValue: %f writeFP16: %s ]",&local_40,args,
             &this->maxComponentValue,&this->writeFP16);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GBufferFilm::ToString() const {
    return StringPrintf("[ GBufferFilm %s colorSpace: %s maxComponentValue: %f "
                        "writeFP16: %s ]",
                        BaseToString(), *colorSpace, maxComponentValue, writeFP16);
}